

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int generateOutputSubroutine
              (Parse *pParse,Select *p,SelectDest *pIn,SelectDest *pDest,int regReturn,int regPrev,
              KeyInfo *pKeyInfo,int p4type,int iBreak)

{
  int iVar1;
  Vdbe *p_00;
  byte bVar2;
  char cVar3;
  uint p2;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  p_00 = pParse->pVdbe;
  iVar1 = p_00->nOp;
  p2 = sqlite3VdbeMakeLabel(p_00);
  if (regPrev != 0) {
    uVar4 = sqlite3VdbeAddOp3(p_00,0x1c,regPrev,0,0);
    iVar5 = sqlite3VdbeAddOp3(p_00,0x18,pIn->iSdst,regPrev + 1,pIn->nSdst);
    sqlite3VdbeChangeP4(p_00,iVar5,(char *)pKeyInfo,p4type);
    sqlite3VdbeAddOp3(p_00,0x19,iVar5 + 2,p2,iVar5 + 2);
    if ((-1 < (int)uVar4) && (uVar4 < (uint)p_00->nOp)) {
      p_00->aOp[uVar4].p2 = p_00->nOp;
    }
    sqlite3VdbeAddOp3(p_00,0xe,pIn->iSdst,regPrev + 1,pIn->nSdst + -1);
    sqlite3VdbeAddOp3(p_00,7,1,regPrev,0);
  }
  iVar5 = 0;
  if (pParse->db->mallocFailed == '\0') {
    codeOffset(p_00,p,p2);
    switch(pDest->eDest) {
    case '\x06':
      sqlite3ExprCodeMove(pParse,pIn->iSdst,pDest->iSDParm,1);
      break;
    case '\a':
      cVar3 = sqlite3CompareAffinity(p->pEList->a->pExpr,pDest->affSdst);
      pDest->affSdst = cVar3;
      if (pParse->nTempReg == '\0') {
        iVar5 = pParse->nMem + 1;
        pParse->nMem = iVar5;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar5 = pParse->aTempReg[bVar2];
      }
      iVar7 = sqlite3VdbeAddOp3(p_00,0x1f,pIn->iSdst,1,iVar5);
      sqlite3VdbeChangeP4(p_00,iVar7,&pDest->affSdst,1);
      sqlite3ExprCacheRemove(pParse,pIn->iSdst,1);
      sqlite3VdbeAddOp3(p_00,0x61,pDest->iSDParm,iVar5,0);
      if (iVar5 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar6 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar6) == iVar5) {
              (&pParse->aColCache[0].tempReg)[lVar6] = '\x01';
              goto LAB_00165ee0;
            }
            lVar6 = lVar6 + 0x18;
          } while ((int)lVar6 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar5;
        }
      }
      break;
    case '\b':
    case '\t':
      if (pParse->nTempReg == '\0') {
        iVar5 = pParse->nMem + 1;
        pParse->nMem = iVar5;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar5 = pParse->aTempReg[bVar2];
      }
      if (pParse->nTempReg == '\0') {
        iVar7 = pParse->nMem + 1;
        pParse->nMem = iVar7;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar7 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(p_00,0x1f,pIn->iSdst,pIn->nSdst,iVar5);
      sqlite3VdbeAddOp3(p_00,0x38,pDest->iSDParm,iVar7,0);
      sqlite3VdbeAddOp3(p_00,0x39,pDest->iSDParm,iVar5,iVar7);
      if (p_00->aOp != (Op *)0x0) {
        p_00->aOp[(long)p_00->nOp + -1].p5 = '\b';
      }
      if (iVar7 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar6 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar6) == iVar7) {
              (&pParse->aColCache[0].tempReg)[lVar6] = '\x01';
              goto LAB_00165e70;
            }
            lVar6 = lVar6 + 0x18;
          } while ((int)lVar6 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar7;
        }
      }
LAB_00165e70:
      if (iVar5 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          lVar6 = 0;
          do {
            if (*(int *)((long)&pParse->aColCache[0].iReg + lVar6) == iVar5) {
              (&pParse->aColCache[0].tempReg)[lVar6] = '\x01';
              goto LAB_00165ee0;
            }
            lVar6 = lVar6 + 0x18;
          } while ((int)lVar6 != 0xf0);
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar5;
        }
      }
      break;
    case '\n':
      if (pDest->iSdst == 0) {
        iVar5 = pIn->nSdst;
        if (pParse->nRangeReg < iVar5) {
          iVar7 = pParse->nMem + 1;
          pParse->nMem = pParse->nMem + iVar5;
        }
        else {
          iVar7 = pParse->iRangeReg;
          pParse->iRangeReg = iVar7 + iVar5;
          pParse->nRangeReg = pParse->nRangeReg - iVar5;
        }
        pDest->iSdst = iVar7;
        pDest->nSdst = iVar5;
      }
      sqlite3ExprCodeMove(pParse,pIn->iSdst,pDest->iSdst,pDest->nSdst);
      sqlite3VdbeAddOp3(p_00,4,pDest->iSDParm,0,0);
      break;
    default:
      sqlite3VdbeAddOp3(p_00,0x10,pIn->iSdst,pIn->nSdst,0);
      sqlite3ExprCacheRemove(pParse,pIn->iSdst,pIn->nSdst);
    }
LAB_00165ee0:
    if (p->iLimit != 0) {
      sqlite3VdbeAddOp3(p_00,0x7a,p->iLimit,iBreak,-1);
    }
    if (p_00->aLabel != (int *)0x0) {
      p_00->aLabel[(int)~p2] = p_00->nOp;
    }
    sqlite3VdbeAddOp3(p_00,3,regReturn,0,0);
    iVar5 = iVar1;
  }
  return iVar5;
}

Assistant:

static int generateOutputSubroutine(
  Parse *pParse,          /* Parsing context */
  Select *p,              /* The SELECT statement */
  SelectDest *pIn,        /* Coroutine supplying data */
  SelectDest *pDest,      /* Where to send the data */
  int regReturn,          /* The return address register */
  int regPrev,            /* Previous result register.  No uniqueness if 0 */
  KeyInfo *pKeyInfo,      /* For comparing with previous entry */
  int p4type,             /* The p4 type for pKeyInfo */
  int iBreak              /* Jump here if we hit the LIMIT */
){
  Vdbe *v = pParse->pVdbe;
  int iContinue;
  int addr;

  addr = sqlite3VdbeCurrentAddr(v);
  iContinue = sqlite3VdbeMakeLabel(v);

  /* Suppress duplicates for UNION, EXCEPT, and INTERSECT 
  */
  if( regPrev ){
    int j1, j2;
    j1 = sqlite3VdbeAddOp1(v, OP_IfNot, regPrev);
    j2 = sqlite3VdbeAddOp4(v, OP_Compare, pIn->iSdst, regPrev+1, pIn->nSdst,
                              (char*)pKeyInfo, p4type);
    sqlite3VdbeAddOp3(v, OP_Jump, j2+2, iContinue, j2+2);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3VdbeAddOp3(v, OP_Copy, pIn->iSdst, regPrev+1, pIn->nSdst-1);
    sqlite3VdbeAddOp2(v, OP_Integer, 1, regPrev);
  }
  if( pParse->db->mallocFailed ) return 0;

  /* Suppress the first OFFSET entries if there is an OFFSET clause
  */
  codeOffset(v, p, iContinue);

  switch( pDest->eDest ){
    /* Store the result as data using a unique key.
    */
    case SRT_Table:
    case SRT_EphemTab: {
      int r1 = sqlite3GetTempReg(pParse);
      int r2 = sqlite3GetTempReg(pParse);
      testcase( pDest->eDest==SRT_Table );
      testcase( pDest->eDest==SRT_EphemTab );
      sqlite3VdbeAddOp3(v, OP_MakeRecord, pIn->iSdst, pIn->nSdst, r1);
      sqlite3VdbeAddOp2(v, OP_NewRowid, pDest->iSDParm, r2);
      sqlite3VdbeAddOp3(v, OP_Insert, pDest->iSDParm, r1, r2);
      sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
      sqlite3ReleaseTempReg(pParse, r2);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#ifndef SQLITE_OMIT_SUBQUERY
    /* If we are creating a set for an "expr IN (SELECT ...)" construct,
    ** then there should be a single item on the stack.  Write this
    ** item into the set table with bogus data.
    */
    case SRT_Set: {
      int r1;
      assert( pIn->nSdst==1 );
      pDest->affSdst = 
         sqlite3CompareAffinity(p->pEList->a[0].pExpr, pDest->affSdst);
      r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, pIn->iSdst, 1, r1, &pDest->affSdst,1);
      sqlite3ExprCacheAffinityChange(pParse, pIn->iSdst, 1);
      sqlite3VdbeAddOp2(v, OP_IdxInsert, pDest->iSDParm, r1);
      sqlite3ReleaseTempReg(pParse, r1);
      break;
    }

#if 0  /* Never occurs on an ORDER BY query */
    /* If any row exist in the result set, record that fact and abort.
    */
    case SRT_Exists: {
      sqlite3VdbeAddOp2(v, OP_Integer, 1, pDest->iSDParm);
      /* The LIMIT clause will terminate the loop for us */
      break;
    }
#endif

    /* If this is a scalar select that is part of an expression, then
    ** store the results in the appropriate memory cell and break out
    ** of the scan loop.
    */
    case SRT_Mem: {
      assert( pIn->nSdst==1 );
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSDParm, 1);
      /* The LIMIT clause will jump out of the loop for us */
      break;
    }
#endif /* #ifndef SQLITE_OMIT_SUBQUERY */

    /* The results are stored in a sequence of registers
    ** starting at pDest->iSdst.  Then the co-routine yields.
    */
    case SRT_Coroutine: {
      if( pDest->iSdst==0 ){
        pDest->iSdst = sqlite3GetTempRange(pParse, pIn->nSdst);
        pDest->nSdst = pIn->nSdst;
      }
      sqlite3ExprCodeMove(pParse, pIn->iSdst, pDest->iSdst, pDest->nSdst);
      sqlite3VdbeAddOp1(v, OP_Yield, pDest->iSDParm);
      break;
    }

    /* If none of the above, then the result destination must be
    ** SRT_Output.  This routine is never called with any other
    ** destination other than the ones handled above or SRT_Output.
    **
    ** For SRT_Output, results are stored in a sequence of registers.  
    ** Then the OP_ResultRow opcode is used to cause sqlite3_step() to
    ** return the next row of result.
    */
    default: {
      assert( pDest->eDest==SRT_Output );
      sqlite3VdbeAddOp2(v, OP_ResultRow, pIn->iSdst, pIn->nSdst);
      sqlite3ExprCacheAffinityChange(pParse, pIn->iSdst, pIn->nSdst);
      break;
    }
  }

  /* Jump to the end of the loop if the LIMIT is reached.
  */
  if( p->iLimit ){
    sqlite3VdbeAddOp3(v, OP_IfZero, p->iLimit, iBreak, -1);
  }

  /* Generate the subroutine return
  */
  sqlite3VdbeResolveLabel(v, iContinue);
  sqlite3VdbeAddOp1(v, OP_Return, regReturn);

  return addr;
}